

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::set_uint_val(char *ext,ulong val)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  char *in_RSI;
  char *in_RDI;
  uint dig;
  int exp;
  size_t prec;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  int iVar3;
  
  sVar2 = get_prec((char *)0x3134c8);
  in_RDI[4] = '\0';
  set_type(in_RDI,0);
  set_neg(in_RDI,0);
  memset(in_RDI + 5,0,sVar2 + 1 >> 1);
  iVar3 = 0;
  while (in_RSI != (char *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    in_stack_ffffffffffffffe0 = SUB164(auVar1 % ZEXT816(10),0);
    in_RSI = (char *)((ulong)in_RSI / 10);
    shift_right(in_RSI,(uint)(sVar2 >> 0x20));
    set_dig(in_RDI,0,in_stack_ffffffffffffffe0);
    iVar3 = iVar3 + 1;
  }
  set_exp((char *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  normalize(in_RSI);
  return;
}

Assistant:

void CVmObjBigNum::set_uint_val(char *ext, ulong val)
{
    size_t prec;
    int exp;

    /* get the precision */
    prec = get_prec(ext);

    /* set the type to number */
    ext[VMBN_FLAGS] = 0;
    set_type(ext, VMBN_T_NUM);

    /* the value is unsigned, so it's non-negative */
    set_neg(ext, FALSE);

    /* initially zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* initialize the exponent to zero */
    exp = 0;

    /* shift the integer value into the value */
    while (val != 0)
    {
        unsigned int dig;

        /* get the low-order digit of the value */
        dig = (unsigned int)(val % 10);

        /* shift the value one place */
        val /= 10;

        /* 
         *   shift our number one place right to accommodate this next
         *   higher-order digit 
         */
        shift_right(ext, 1);

        /* set the new most significant digit */
        set_dig(ext, 0, dig);

        /* that's another factor of 10 */
        ++exp;
    }

    /* set the exponent */
    set_exp(ext, exp);

    /* normalize the number */
    normalize(ext);
}